

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

char * cppcms_capi_session_get_binary_as_hex(cppcms_capi_session *session,char *key)

{
  uint uVar1;
  session_interface *psVar2;
  char *pcVar3;
  cppcms_capi_session *pcVar4;
  bool bVar5;
  string *psVar6;
  ulong uVar7;
  ulong uVar8;
  string tmp;
  allocator local_59;
  cppcms_capi_session *local_58;
  string local_50;
  
  if (session != (cppcms_capi_session *)0x0) {
    anon_unknown.dwarf_329815::check_str(key);
    cppcms_capi_session::check_loaded(session);
    psVar2 = (session->p).ptr_;
    std::__cxx11::string::string((string *)&local_50,key,&local_59);
    bVar5 = cppcms::session_interface::is_set(psVar2,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar5) {
      psVar2 = (session->p).ptr_;
      local_58 = session;
      std::__cxx11::string::string((string *)&local_50,key,&local_59);
      psVar6 = cppcms::session_interface::operator[](psVar2,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      uVar1 = (uint)psVar6->_M_string_length;
      std::__cxx11::string::reserve((ulong)&local_50);
      uVar8 = 0;
      uVar7 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar7 = uVar8;
      }
      for (; pcVar4 = local_58, uVar7 != uVar8; uVar8 = uVar8 + 1) {
        std::__cxx11::string::push_back((char)&local_50);
        std::__cxx11::string::push_back((char)&local_50);
      }
      std::__cxx11::string::swap((string *)&local_58->returned_value);
      pcVar3 = (pcVar4->returned_value)._M_dataplus._M_p;
      std::__cxx11::string::~string((string *)&local_50);
      return pcVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

char const *cppcms_capi_session_get_binary_as_hex(cppcms_capi_session *session,char const *key)
{
	TRY {
		if(!session)
			return 0;
		check_str(key);
		session->check_loaded();

		if(!session->p->is_set(key))
			return 0;
		std::string const &value = (*(session->p))[key];
		std::string tmp;
		int len = value.size();
		tmp.reserve(len*2);
		for(int i=0;i<len;i++) {
			static char const *digits="0123456789abcdef";
			unsigned char c=value[i];
			tmp+=digits[(c >> 4u & 0xFu)];
			tmp+=digits[(c & 0xFu)];
		}
		session->returned_value.swap(tmp);
		return session->returned_value.c_str();
	}